

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O3

void exchange_bounds(void *b_,ReduceProxy *srp)

{
  pointer pBVar1;
  pointer pBVar2;
  Master *this;
  Link *pLVar3;
  int iVar4;
  pointer pBVar5;
  mapped_type *bb;
  mapped_type *bb_00;
  long lVar6;
  long lVar7;
  BlockID local_b0;
  pointer local_a8;
  pointer local_a0;
  size_t local_80;
  pointer local_78;
  pointer local_68;
  pointer local_60;
  size_t local_40;
  pointer local_38;
  
  if (srp->round_ == 0) {
    if (0 < (int)((ulong)((long)(srp->out_link_).neighbors_.
                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(srp->out_link_).neighbors_.
                               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar6 = 0;
      do {
        this = (srp->super_Proxy).master_;
        iVar4 = diy::Master::lid(this,(srp->super_Proxy).gid_);
        pLVar3 = (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar4];
        local_b0 = (srp->out_link_).neighbors_.
                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
        bb_00 = Catch::clara::std::
                map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                ::operator[](&(srp->super_Proxy).outgoing_,(key_type *)&local_b0);
        diy::Serialization<diy::DynamicPoint<float,_4UL>_>::save
                  (&bb_00->super_BinaryBuffer,
                   (Point *)((long)&pLVar3[7].neighbors_.
                                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                            + 8));
        diy::Serialization<diy::DynamicPoint<float,_4UL>_>::save
                  (&bb_00->super_BinaryBuffer,
                   (Point *)((long)&pLVar3[9].neighbors_.
                                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                            + 8));
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)((ulong)((long)(srp->out_link_).neighbors_.
                                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(srp->out_link_).neighbors_.
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
  }
  else {
    pBVar5 = (srp->in_link_).neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar1 = (srp->in_link_).neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_start;
    diy::Bounds<float>::Bounds((Bounds<float> *)&local_b0,0);
    Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::resize
              ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)((long)b_ + 0x98)
               ,(long)(int)((ulong)((long)pBVar5 - (long)pBVar1) >> 3),(Bounds<float> *)&local_b0);
    local_60 = local_68;
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,local_40 << 2);
    }
    local_a0 = local_a8;
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78,local_80 << 2);
    }
    pBVar5 = (srp->in_link_).neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(srp->in_link_).neighbors_.
                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) >> 3)) {
      lVar6 = 0x40;
      lVar7 = 0;
      do {
        pBVar2 = (((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)
                  ((long)b_ + 0x98))->
                 super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_b0.gid = pBVar5[lVar7].gid;
        bb = Catch::clara::std::
             map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
             ::operator[](&(srp->super_Proxy).incoming_,(key_type *)&local_b0);
        diy::Serialization<diy::DynamicPoint<float,_4UL>_>::load
                  (&bb->super_BinaryBuffer,(Point *)((long)(&pBVar2->min + -1) + lVar6));
        diy::Serialization<diy::DynamicPoint<float,_4UL>_>::load
                  (&bb->super_BinaryBuffer,
                   (Point *)((long)(pBVar2->min).
                                   super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                                   m_static_data + lVar6 + 0xffffffffffffffe0U));
        lVar7 = lVar7 + 1;
        pBVar5 = (srp->in_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x80;
      } while (lVar7 < (int)((ulong)((long)(srp->in_link_).neighbors_.
                                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5
                                    ) >> 3));
    }
  }
  return;
}

Assistant:

void exchange_bounds(void* b_, const diy::ReduceProxy& srp)
{
  Block*   b   = static_cast<Block*>(b_);

  if (srp.round() == 0)
      for (int i = 0; i < srp.out_link().size(); ++i)
      {
          RCLink* link = static_cast<RCLink*>(srp.master()->link(srp.master()->lid(srp.gid())));
          srp.enqueue(srp.out_link().target(i), link->bounds());
      }
  else
  {
      b->block_bounds.resize(srp.in_link().size(), 0);
      for (int i = 0; i < srp.in_link().size(); ++i)
      {
        assert(i == srp.in_link().target(i).gid);
        srp.dequeue(srp.in_link().target(i).gid, b->block_bounds[i]);
      }
  }
}